

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::ebml_read_float(MatroskaDemuxer *this,uint32_t *id,double *num)

{
  double dVar1;
  int iVar2;
  uint v;
  uint64_t v_00;
  ostream *poVar3;
  undefined4 *puVar4;
  float fVar5;
  uint *local_1b8;
  undefined8 local_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  int64_t size;
  ostringstream ss;
  
  iVar2 = ebml_read_element_id(this,id,(int *)0x0);
  if (-1 < iVar2) {
    iVar2 = ebml_read_element_length(this,&size);
    if (-1 < iVar2) {
      if (size == 8) {
        v_00 = IOContextDemuxer::get_be64(&this->super_IOContextDemuxer);
        dVar1 = av_int2dbl(v_00);
      }
      else {
        if (size != 4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          poVar3 = std::operator<<((ostream *)&ss,"Invalid float element size ");
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          poVar3 = std::operator<<(poVar3," at position ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar4 = 900;
          *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
          if (local_1b8 == &local_1a8) {
            puVar4[6] = local_1a8;
            puVar4[7] = uStack_1a4;
            puVar4[8] = uStack_1a0;
            puVar4[9] = uStack_19c;
          }
          else {
            *(uint **)(puVar4 + 2) = local_1b8;
            *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1a4,local_1a8);
          }
          *(undefined8 *)(puVar4 + 4) = local_1b0;
          local_1a8 = local_1a8 & 0xffffff00;
          __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        v = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
        fVar5 = av_int2flt(v);
        dVar1 = (double)fVar5;
      }
      *num = dVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int MatroskaDemuxer::ebml_read_float(uint32_t *id, double *num)
{
    int res;
    int64_t size;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&size)) < 0)
        return res;

    if (size == 4)
    {
        *num = av_int2flt(get_be32());
    }
    else if (size == 8)
    {
        *num = av_int2dbl(get_be64());
    }
    else
    {
        const offset_t pos = m_processedBytes;
        THROW(ERR_MATROSKA_PARSE, "Invalid float element size " << size << " at position " << pos)
    }
    return 0;
}